

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_Wander(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *self;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_004003d0;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004003c0:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004003d0:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x8ef,
                  "int AF_AActor_A_Wander(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_00400388;
    bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004003d0;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_004003c0;
LAB_00400388:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_004003a8:
      A_Wander(self,param[1].field_0.i);
      return 0;
    }
    pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_004003a8;
    pcVar2 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x8f0,"int AF_AActor_A_Wander(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Wander)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);
	A_Wander(self, flags);
	return 0;
}